

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSpatialAlgebra.h
# Opt level: O1

void __thiscall btSymmetricSpatialDyad::btSymmetricSpatialDyad(btSymmetricSpatialDyad *this)

{
  btVector3 *pbVar1;
  
  (this->m_topLeftMat).m_el[0].m_floats[0] = 1.0;
  (this->m_topLeftMat).m_el[0].m_floats[1] = 0.0;
  (this->m_topLeftMat).m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_topLeftMat).m_el[0].m_floats + 3) = 0;
  (this->m_topLeftMat).m_el[1].m_floats[1] = 1.0;
  pbVar1 = (this->m_topLeftMat).m_el;
  pbVar1[1].m_floats[2] = 0.0;
  pbVar1[1].m_floats[3] = 0.0;
  (this->m_topLeftMat).m_el[2].m_floats[0] = 0.0;
  (this->m_topLeftMat).m_el[2].m_floats[1] = 0.0;
  pbVar1 = (this->m_topLeftMat).m_el;
  pbVar1[2].m_floats[2] = 1.0;
  pbVar1[2].m_floats[3] = 0.0;
  (this->m_topRightMat).m_el[0].m_floats[0] = 1.0;
  (this->m_topRightMat).m_el[0].m_floats[1] = 0.0;
  (this->m_topRightMat).m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_topRightMat).m_el[0].m_floats + 3) = 0;
  (this->m_topRightMat).m_el[1].m_floats[1] = 1.0;
  pbVar1 = (this->m_topRightMat).m_el;
  pbVar1[1].m_floats[2] = 0.0;
  pbVar1[1].m_floats[3] = 0.0;
  (this->m_topRightMat).m_el[2].m_floats[0] = 0.0;
  (this->m_topRightMat).m_el[2].m_floats[1] = 0.0;
  pbVar1 = (this->m_topRightMat).m_el;
  pbVar1[2].m_floats[2] = 1.0;
  pbVar1[2].m_floats[3] = 0.0;
  (this->m_bottomLeftMat).m_el[0].m_floats[0] = 1.0;
  (this->m_bottomLeftMat).m_el[0].m_floats[1] = 0.0;
  (this->m_bottomLeftMat).m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_bottomLeftMat).m_el[0].m_floats + 3) = 0;
  (this->m_bottomLeftMat).m_el[1].m_floats[1] = 1.0;
  pbVar1 = (this->m_bottomLeftMat).m_el;
  pbVar1[1].m_floats[2] = 0.0;
  pbVar1[1].m_floats[3] = 0.0;
  (this->m_bottomLeftMat).m_el[2].m_floats[0] = 0.0;
  (this->m_bottomLeftMat).m_el[2].m_floats[1] = 0.0;
  pbVar1 = (this->m_bottomLeftMat).m_el;
  pbVar1[2].m_floats[2] = 1.0;
  pbVar1[2].m_floats[3] = 0.0;
  return;
}

Assistant:

btSymmetricSpatialDyad() { setIdentity(); }